

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.cc
# Opt level: O3

void dynet::TensorTools::identity(Tensor *val)

{
  uint uVar1;
  float *pfVar2;
  ulong uVar3;
  runtime_error *this;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  float fVar7;
  
  if (((val->d).nd == 2) && (uVar1 = (val->d).d[0], uVar3 = (ulong)uVar1, uVar1 == (val->d).d[1])) {
    if (val->device->type == CPU) {
      if (uVar3 != 0) {
        pfVar2 = val->v;
        uVar4 = 0;
        lVar5 = 0;
        do {
          uVar6 = 0;
          do {
            fVar7 = 1.0;
            if (uVar4 != uVar6) {
              fVar7 = 0.0;
            }
            pfVar2[lVar5 + uVar6] = fVar7;
            uVar6 = uVar6 + 1;
          } while (uVar3 != uVar6);
          uVar4 = uVar4 + 1;
          lVar5 = lVar5 + uVar6;
        } while (uVar4 != uVar3);
      }
      return;
    }
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Bad device type");
  }
  else {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this,"Attempt to set a tensor that is not a square matrix to identity");
  }
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void TensorTools::identity(Tensor& val) {
  if (val.d.nd != 2 || val.d[0] != val.d[1])
    throw std::runtime_error("Attempt to set a tensor that is not a square matrix to identity");
  size_t pos = 0;
  if (val.device->type == DeviceType::CPU) {
    for (size_t i = 0; i < val.d[0]; ++i)
      for (size_t j = 0; j < val.d[1]; ++j)
        val.v[pos++] = (i == j ? 1 : 0);
#if HAVE_CUDA
  } else if (val.device->type == DeviceType::GPU) {
    float* t = new float[val.d.size()];
    for (size_t i = 0; i < val.d[0]; ++i)
      for (size_t j = 0; j < val.d[1]; ++j)
        t[pos++] = (i == j ? 1 : 0);
    CUDA_CHECK(cudaMemcpy(val.v, t, sizeof(real) * val.d.size(), cudaMemcpyHostToDevice));
    delete[] t;
#endif
  } else { throw std::runtime_error("Bad device type"); }
}